

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O3

Type5UUIDFilenameResolver * __thiscall
AS_02::TimedText::Type5UUIDFilenameResolver::OpenRead
          (Type5UUIDFilenameResolver *this,string *dirname)

{
  Type5UUIDFilenameResolver *pTVar1;
  int iVar2;
  char in_DL;
  char cVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  DirectoryEntryType_t ft;
  string next_item;
  byte_t read_buffer [16];
  UUID asset_id;
  string abs_dirname;
  string tmp_path;
  DirScannerEx dir_reader;
  UUID asset_id_1;
  Result_t read_result;
  FileReader reader;
  int local_224;
  undefined1 local_220 [17];
  byte_t abStack_20f [4];
  byte_t abStack_20b [11];
  _Alloc_hider local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [3];
  char *local_1b8;
  long local_1b0;
  char local_1a8;
  undefined7 uStack_1a7;
  uint local_198;
  uint uStack_194;
  _func_int **local_180;
  Type5UUIDFilenameResolver *local_178;
  UUID local_170;
  long *local_150;
  long local_148;
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  DirScannerEx local_110 [40];
  UUID local_e8;
  int local_c8 [26];
  FileReader local_60 [48];
  
  Kumu::DirScannerEx::DirScannerEx(local_110);
  local_1b8 = &local_1a8;
  local_1b0 = 0;
  local_1a8 = '\0';
  Kumu::PathMakeCanonical((string *)&local_150,in_DL);
  if (local_148 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_150,0,(char *)0x0,0x1585e2);
  }
  Kumu::DirScannerEx::Open((string *)this);
  local_178 = this;
  if (-1 < *(int *)&(this->super_IResourceResolver)._vptr_IResourceResolver) {
    local_180 = (_func_int **)&PTR__IArchive_0016b2b8;
    while( true ) {
      Kumu::DirScannerEx::GetNext((string *)local_c8,(DirectoryEntryType_t *)local_110);
      iVar2 = local_c8[0];
      Kumu::Result_t::~Result_t((Result_t *)local_c8);
      if (iVar2 < 0) break;
      if (*local_1b8 != '.') {
        cVar3 = (char)(string *)&local_1b8;
        Kumu::PathJoin((string *)local_130,(string *)&local_150,cVar3);
        if (local_224 == 0) {
          Kumu::FileReader::FileReader(local_60);
          Kumu::FileReader::OpenRead((string *)local_c8);
          if (-1 < local_c8[0]) {
            Kumu::FileReader::Read((uchar *)local_220,(uint)local_60,&local_198);
            Kumu::Result_t::operator=((Result_t *)local_c8,(Result_t *)local_220);
            Kumu::Result_t::~Result_t((Result_t *)local_220);
            if (-1 < local_c8[0]) {
              if (CONCAT44(uStack_194,local_198) == 0xa1a0a0d474e5089) {
                Kumu::PathBasename((string *)local_220,cVar3);
                create_4122_type5_id(&local_170,(string *)local_220,s_png_id_prefix);
                if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                  operator_delete((void *)local_220._0_8_,
                                  CONCAT35(abStack_20b._0_3_,CONCAT41(abStack_20f,local_220[0x10]))
                                  + 1);
                }
                local_220[8] = local_170.super_Identifier<16U>.m_HasValue;
                local_220[9] = local_170.super_Identifier<16U>.m_Value[0];
                local_220[10] = local_170.super_Identifier<16U>.m_Value[1];
                local_220[0xb] = local_170.super_Identifier<16U>.m_Value[2];
                local_220[0xc] = local_170.super_Identifier<16U>.m_Value[3];
                local_220[0xd] = local_170.super_Identifier<16U>.m_Value[4];
                local_220[0xe] = local_170.super_Identifier<16U>.m_Value[5];
                local_220[0xf] = local_170.super_Identifier<16U>.m_Value[6];
                local_220[0x10] = local_170.super_Identifier<16U>.m_Value[7];
                abStack_20f[0] = local_170.super_Identifier<16U>.m_Value[8];
                abStack_20f[1] = local_170.super_Identifier<16U>.m_Value[9];
                abStack_20f[2] = local_170.super_Identifier<16U>.m_Value[10];
                abStack_20f[3] = local_170.super_Identifier<16U>.m_Value[0xb];
                abStack_20b[0] = local_170.super_Identifier<16U>.m_Value[0xc];
                abStack_20b[1] = local_170.super_Identifier<16U>.m_Value[0xd];
                abStack_20b[2] = local_170.super_Identifier<16U>.m_Value[0xe];
                abStack_20b[3] = local_170.super_Identifier<16U>.m_Value[0xf];
                local_220._0_8_ = local_180;
                local_200._M_p = (pointer)local_1f0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_200,local_1b8,local_1b8 + local_1b0);
                std::
                _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                ::_M_insert_unique<std::pair<Kumu::UUID_const,std::__cxx11::string>>
                          ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                            *)&dirname->_M_string_length,
                           (pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_220);
                uVar4 = local_1f0[0]._M_allocated_capacity;
                _Var5._M_p = local_200._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_p != local_1f0) {
LAB_00149a75:
                  operator_delete(_Var5._M_p,uVar4 + 1);
                }
              }
              else if (((uStack_194 & 0xff) == 0 && local_198 == 0x4f54544f) ||
                      ((uStack_194 & 0xff) == 0 && local_198 == 0x100)) {
                local_220._0_8_ = local_220 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"");
                Kumu::PathSetExtension((string *)&local_170,(string *)&local_1b8);
                if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                  operator_delete((void *)local_220._0_8_,
                                  CONCAT35(abStack_20b._0_3_,CONCAT41(abStack_20f,local_220[0x10]))
                                  + 1);
                }
                Kumu::PathBasename((string *)local_220,(char)&local_170);
                create_4122_type5_id(&local_e8,(string *)local_220,s_font_id_prefix);
                if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
                  operator_delete((void *)local_220._0_8_,
                                  CONCAT35(abStack_20b._0_3_,CONCAT41(abStack_20f,local_220[0x10]))
                                  + 1);
                }
                local_220[8] = local_e8.super_Identifier<16U>.m_HasValue;
                local_220[9] = local_e8.super_Identifier<16U>.m_Value[0];
                local_220[10] = local_e8.super_Identifier<16U>.m_Value[1];
                local_220[0xb] = local_e8.super_Identifier<16U>.m_Value[2];
                local_220[0xc] = local_e8.super_Identifier<16U>.m_Value[3];
                local_220[0xd] = local_e8.super_Identifier<16U>.m_Value[4];
                local_220[0xe] = local_e8.super_Identifier<16U>.m_Value[5];
                local_220[0xf] = local_e8.super_Identifier<16U>.m_Value[6];
                local_220[0x10] = local_e8.super_Identifier<16U>.m_Value[7];
                abStack_20f[0] = local_e8.super_Identifier<16U>.m_Value[8];
                abStack_20f[1] = local_e8.super_Identifier<16U>.m_Value[9];
                abStack_20f[2] = local_e8.super_Identifier<16U>.m_Value[10];
                abStack_20f[3] = local_e8.super_Identifier<16U>.m_Value[0xb];
                abStack_20b[0] = local_e8.super_Identifier<16U>.m_Value[0xc];
                abStack_20b[1] = local_e8.super_Identifier<16U>.m_Value[0xd];
                abStack_20b[2] = local_e8.super_Identifier<16U>.m_Value[0xe];
                abStack_20b[3] = local_e8.super_Identifier<16U>.m_Value[0xf];
                local_220._0_8_ = local_180;
                local_200._M_p = (pointer)local_1f0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_200,local_1b8,local_1b8 + local_1b0);
                std::
                _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                ::_M_insert_unique<std::pair<Kumu::UUID_const,std::__cxx11::string>>
                          ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,std::__cxx11::string>,std::_Select1st<std::pair<Kumu::UUID_const,std::__cxx11::string>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,std::__cxx11::string>>>
                            *)&dirname->_M_string_length,
                           (pair<const_Kumu::UUID,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)local_220);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_200._M_p != local_1f0) {
                  operator_delete(local_200._M_p,local_1f0[0]._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_170.super_Identifier<16U>.super_IArchive._vptr_IArchive !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_170.super_Identifier<16U>.m_Value + 7)) {
                  uVar4 = CONCAT35(local_170.super_Identifier<16U>.m_Value._12_3_,
                                   CONCAT41(local_170.super_Identifier<16U>.m_Value._8_4_,
                                            local_170.super_Identifier<16U>.m_Value[7]));
                  _Var5._M_p = (pointer)local_170.super_Identifier<16U>.super_IArchive.
                                        _vptr_IArchive;
                  goto LAB_00149a75;
                }
              }
            }
          }
          Kumu::Result_t::~Result_t((Result_t *)local_c8);
          Kumu::FileReader::~FileReader(local_60);
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0],local_120[0] + 1);
        }
      }
    }
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  pTVar1 = local_178;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
  }
  Kumu::DirScannerEx::~DirScannerEx(local_110);
  return pTVar1;
}

Assistant:

Result_t
AS_02::TimedText::Type5UUIDFilenameResolver::OpenRead(const std::string& dirname)
{
  DirScannerEx dir_reader;
  DirectoryEntryType_t ft;
  std::string next_item;
  std::string abs_dirname = PathMakeCanonical(dirname);
  byte_t read_buffer[16];

  if ( abs_dirname.empty() )
    {
      abs_dirname = ".";
    }

  Result_t result = dir_reader.Open(abs_dirname);

  if ( KM_SUCCESS(result) )
    {
      while ( KM_SUCCESS(dir_reader.GetNext(next_item, ft)) )
        {
          if ( next_item[0] == '.' ) continue; // no hidden files
	  std::string tmp_path = PathJoin(abs_dirname, next_item);

	  if ( ft == DET_FILE )
	    {
	      FileReader reader;
	      Result_t read_result = reader.OpenRead(tmp_path);

	      if ( KM_SUCCESS(read_result) )
		{
		  read_result = reader.Read(read_buffer, 16);
		}

	      if ( KM_SUCCESS(read_result) )
		{
		  // is it PNG?
		  if ( memcmp(read_buffer, PNGMagic, sizeof(PNGMagic)) == 0 )
		    {
		      UUID asset_id = CreatePNGNameId(PathBasename(next_item));
		      m_ResourceMap.insert(ResourceMap::value_type(asset_id, next_item));
		    }
		  // is it a font?
		  else if ( memcmp(read_buffer, OpenTypeMagic, sizeof(OpenTypeMagic)) == 0
			    || memcmp(read_buffer, TrueTypeMagic, sizeof(TrueTypeMagic)) == 0 )
		    {
		      std::string font_root_name = PathSetExtension(next_item, "");
		      UUID asset_id = CreateFontNameId(PathBasename(font_root_name));
		      m_ResourceMap.insert(ResourceMap::value_type(asset_id, next_item));
		    }
		}
	    }
	}
    }

  return result;
}